

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O0

void swrenderer::R_DrawParticle_C(vissprite_t *vis)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  DWORD DVar5;
  uint uVar6;
  bool bVar7;
  DWORD DVar8;
  int iVar9;
  uint uVar10;
  int local_58;
  DWORD bg;
  int y;
  int x;
  DWORD *fg2rgb;
  fixed_t bglevel;
  fixed_t fglevel;
  int countbase;
  int x1;
  int ycount;
  int yl;
  BYTE color;
  byte *pbStack_28;
  DWORD fg;
  BYTE *dest;
  int spacing;
  DWORD *bg2rgb;
  vissprite_t *vis_local;
  
  bVar1 = (vis->Style).colormap[(vis->field_14).field_0.startfrac];
  iVar3 = (vis->field_3).field_1.y1;
  iVar4 = (vis->field_3).field_1.y2;
  DVar8 = (DWORD)vis->x1;
  sVar2 = vis->x2;
  R_DrawMaskedSegsBehindParticle(vis);
  DrawerCommandQueue::WaitForWorkers();
  uVar6 = (int)vis->renderflags + 1U & 0xfffffc;
  DVar5 = Col2RGB8[(int)(uVar6 * 0x100) >> 10][bVar1];
  iVar9 = DCanvas::GetPitch(RenderTarget);
  for (bg = DVar8; (int)bg < (int)(DVar8 + ((int)sVar2 - DVar8)); bg = bg + 1) {
    drawerargs::dc_x = bg;
    bVar7 = R_ClipSpriteColumnWithPortals(vis);
    if (!bVar7) {
      pbStack_28 = (byte *)(drawerargs::dc_destorg + (int)(*(int *)(ylookup + (long)iVar3 * 4) + bg)
                           );
      for (local_58 = 0; local_58 < (iVar4 - iVar3) + 1; local_58 = local_58 + 1) {
        uVar10 = DVar5 + Col2RGB8[(int)(uVar6 * -0x100 + 0x10000) >> 10][*pbStack_28] | 0x1f07c1f;
        *pbStack_28 = RGB32k.All[uVar10 & uVar10 >> 0xf];
        pbStack_28 = pbStack_28 + iVar9;
      }
    }
  }
  return;
}

Assistant:

void R_DrawParticle_C (vissprite_t *vis)
{
	DWORD *bg2rgb;
	int spacing;
	BYTE *dest;
	DWORD fg;
	BYTE color = vis->Style.colormap[vis->startfrac];
	int yl = vis->y1;
	int ycount = vis->y2 - yl + 1;
	int x1 = vis->x1;
	int countbase = vis->x2 - x1;

	R_DrawMaskedSegsBehindParticle (vis);

	DrawerCommandQueue::WaitForWorkers();

	// vis->renderflags holds translucency level (0-255)
	{
		fixed_t fglevel, bglevel;
		DWORD *fg2rgb;

		fglevel = ((vis->renderflags + 1) << 8) & ~0x3ff;
		bglevel = FRACUNIT-fglevel;
		fg2rgb = Col2RGB8[fglevel>>10];
		bg2rgb = Col2RGB8[bglevel>>10];
		fg = fg2rgb[color];
	}

	/*

	spacing = RenderTarget->GetPitch() - countbase;
	dest = ylookup[yl] + x1 + dc_destorg;

	do
	{
		int count = countbase;
		do
		{
			DWORD bg = bg2rgb[*dest];
			bg = (fg+bg) | 0x1f07c1f;
			*dest++ = RGB32k.All[bg & (bg>>15)];
		} while (--count);
		dest += spacing;
	} while (--ycount);*/

	// original was row-wise
	// width = countbase
	// height = ycount

	spacing = RenderTarget->GetPitch();

	for (int x = x1; x < (x1+countbase); x++)
	{
		dc_x = x;
		if (R_ClipSpriteColumnWithPortals(vis))
			continue;
		dest = ylookup[yl] + x + dc_destorg;
		for (int y = 0; y < ycount; y++)
		{
			DWORD bg = bg2rgb[*dest];
			bg = (fg+bg) | 0x1f07c1f;
			*dest = RGB32k.All[bg & (bg>>15)];
			dest += spacing;
		}
	}
}